

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  int iVar1;
  float_specs fVar2;
  undefined8 uVar3;
  long lVar4;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar5;
  int **ppiVar6;
  appender aVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  char cVar13;
  undefined8 uVar14;
  sign_t sVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_8_dbbf3351 write;
  digit_grouping<char> grouping;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ff;
  int local_ec;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_e8;
  float_specs local_e0;
  int local_d4;
  void *local_d0;
  format_specs<char> *local_c8;
  undefined1 local_c0 [20];
  undefined1 auStack_ac [20];
  float_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  fVar2 = (float_specs)f->significand;
  lVar4 = 0x3f;
  if (((ulong)fVar2 | 1) != 0) {
    for (; ((ulong)fVar2 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  iVar19 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] -
           (uint)((ulong)fVar2 <
                 (ulong)*(float_specs *)
                         (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                         (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] * 8));
  local_ff._M_local_buf[2] = '0';
  sVar15 = fspecs._5_1_;
  local_ff._M_local_buf[1] = sVar15;
  local_ec = iVar19;
  local_e0 = fVar2;
  local_78 = fspecs;
  if (iVar19 < 0) goto LAB_001f9b90;
  uVar14 = ZEXT48((iVar19 + 1) - (uint)(sVar15 == none));
  local_ff._M_local_buf[0] = '.';
  uVar12 = fspecs._4_4_;
  bVar5.container = (buffer<char> *)fspecs;
  if ((uVar12 >> 0x11 & 1) != 0) {
    local_ff._7_8_ = uVar14;
    local_e8.container = (buffer<char> *)fspecs;
    local_d0 = loc.locale_;
    local_c8 = specs;
    local_ff._M_local_buf[0] = decimal_point_impl<char>(loc);
    specs = local_c8;
    loc.locale_ = local_d0;
    uVar14 = local_ff._7_8_;
    bVar5.container = local_e8.container;
  }
  uVar3 = auStack_ac._4_8_;
  iVar16 = f->exponent;
  iVar1 = iVar19 + iVar16;
  iVar17 = (int)bVar5.container;
  if (fspecs._4_1_ == '\x01') {
LAB_001f98a8:
    iVar16 = iVar19 + iVar16 + -1;
    if ((uVar12 >> 0x13 & 1) == 0) {
      iVar11 = 0;
      if (iVar19 == 1) {
        local_ff._M_local_buf[0] = '\0';
        iVar11 = 0;
      }
    }
    else {
      iVar11 = 0;
      if (0 < iVar17 - iVar19) {
        iVar11 = iVar17 - iVar19;
      }
      uVar14 = ZEXT48((uint)((int)uVar14 + iVar11));
    }
    local_c0[0] = sVar15;
    auStack_ac[0] = local_ff._M_local_buf[0];
    local_c0._16_4_ = iVar19;
    auStack_ac._4_5_ = CONCAT14('0',iVar11);
    auStack_ac._10_2_ = SUB82(uVar3,6);
    auStack_ac._4_8_ =
         CONCAT26(auStack_ac._10_2_,CONCAT15(((uVar12 >> 0x10 & 1) == 0) << 5,auStack_ac._4_5_)) |
         0x450000000000;
    auStack_ac._12_4_ = iVar16;
    local_c0._8_8_ = fVar2;
    if (specs->width < 1) {
      bVar5.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<double>,_char,_fmt::v10::detail::digit_grouping<char>_>
           ::anon_class_40_8_dbbf3351::operator()
                     ((anon_class_40_8_dbbf3351 *)local_c0,
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    else {
      if (iVar1 < 1) {
        iVar16 = 1 - iVar1;
      }
      lVar4 = 2;
      if (99 < iVar16) {
        lVar4 = (ulong)(999 < iVar16) + 3;
      }
      sVar9 = uVar14 + (3 - (ulong)(local_ff._M_local_buf[0] == '\0')) + lVar4;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out,specs,sVar9,sVar9,(anon_class_40_8_dbbf3351 *)local_c0);
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar11 = 0x10;
      if (0 < iVar17) {
        iVar11 = iVar17;
      }
      if ((iVar1 < -3) || (iVar11 < iVar1)) goto LAB_001f98a8;
    }
    local_d4 = iVar1;
    if (iVar16 < 0) {
      if (iVar1 < 1) {
        iVar11 = -iVar1;
        iVar16 = iVar11;
        if (SBORROW4(iVar17,iVar11) != iVar17 + iVar1 < 0) {
          iVar16 = iVar17;
        }
        if (iVar17 < 0) {
          iVar16 = iVar11;
        }
        if (iVar19 != 0) {
          iVar16 = iVar11;
        }
        local_70._M_allocated_capacity._0_4_ = iVar16;
        if (iVar19 == 0 && iVar16 == 0) {
          local_ff._M_local_buf[3] = (char)((uVar12 & 0x80000) >> 0x13);
          iVar19 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
        }
        else {
          local_ff._M_local_buf[3] = 1;
          iVar19 = 2;
          if (iVar16 < 0) {
LAB_001f9b90:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                        ,0x189,"negative value");
          }
        }
        sVar9 = (ulong)(uint)(iVar19 + iVar16) + uVar14;
        local_c0._0_8_ = local_ff._M_local_buf + 1;
        local_c0._8_8_ = local_ff._M_local_buf + 2;
        unique0x00004e80 = local_ff._M_local_buf + 3;
        auStack_ac._4_8_ = &local_ff;
        auStack_ac._12_8_ = &local_70;
        local_98 = &local_e0;
        local_90._M_allocated_capacity = (size_type)&local_ec;
        aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          (out,specs,sVar9,sVar9,(anon_class_56_7_162c6e41 *)local_c0);
        return (appender)
               aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      iVar16 = 0;
      local_ff._M_allocated_capacity._3_4_ = iVar17 - iVar19 & (int)(uVar12 << 0xc) >> 0x1f;
      uVar18 = local_ff._M_allocated_capacity._3_4_;
      if ((int)local_ff._M_allocated_capacity._3_4_ < 1) {
        uVar18 = 0;
      }
      local_ff._7_8_ = uVar14;
      local_e8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
      if (local_98 != (float_specs *)0x0) {
        pcVar8 = (char *)(local_c0._0_8_ + (long)(int *)local_c0._8_8_);
        lVar4 = 0;
        pcVar10 = (char *)local_c0._0_8_;
        do {
          if (pcVar10 == pcVar8) {
            cVar13 = pcVar8[-1];
            pcVar10 = pcVar8;
          }
          else {
            cVar13 = *pcVar10;
            if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_001f9bb7;
            pcVar10 = pcVar10 + 1;
          }
          iVar16 = iVar16 + cVar13;
          if (iVar1 <= iVar16) goto LAB_001f9bb7;
          lVar4 = lVar4 + 1;
        } while( true );
      }
      lVar4 = 0;
LAB_001f9bb7:
      sVar9 = (ulong)uVar18 + local_ff._7_8_ + lVar4 + 1;
      local_70._M_allocated_capacity = (size_type)(local_ff._M_local_buf + 1);
      local_70._8_8_ = &local_e0;
      local_60 = &local_ec;
      local_58 = &local_d4;
      local_50 = &local_ff;
      local_40._M_allocated_capacity = (size_type)(local_ff._M_local_buf + 3);
      local_40._8_8_ = local_ff._M_local_buf + 2;
      local_48 = (digit_grouping<char> *)local_c0;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (local_e8.container,specs,sVar9,sVar9,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_ac._12_8_ != &local_90) {
        operator_delete((void *)auStack_ac._12_8_);
      }
      ppiVar6 = (int **)(local_c0 + 0x10);
    }
    else {
      local_ff._7_8_ = ZEXT48((uint)(iVar16 + (int)uVar14));
      local_ff._M_allocated_capacity._3_4_ = iVar17 - iVar1;
      if ((uVar12 >> 0x13 & 1) != 0) {
        local_ff._7_8_ = local_ff._7_8_ + 1;
        if (fspecs._4_1_ == '\x02' || 0 < (int)local_ff._M_allocated_capacity._3_4_) {
          if (0 < (int)local_ff._M_allocated_capacity._3_4_) {
            local_ff._7_8_ = local_ff._7_8_ + (ulong)(uint)local_ff._M_allocated_capacity._3_4_;
          }
        }
        else {
          local_ff._M_allocated_capacity._3_4_ = 0;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
      iVar19 = 0;
      if (local_48 != (digit_grouping<char> *)0x0) {
        pcVar10 = (char *)(local_70._8_8_ + local_70._M_allocated_capacity);
        lVar4 = 0;
        uVar14 = local_70._M_allocated_capacity;
        do {
          if ((char *)uVar14 == pcVar10) {
            cVar13 = pcVar10[-1];
            uVar14 = pcVar10;
          }
          else {
            cVar13 = *(char *)uVar14;
            if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_001f9ad3;
            uVar14 = (char *)(uVar14 + 1);
          }
          iVar19 = iVar19 + cVar13;
          if (iVar1 <= iVar19) goto LAB_001f9ad3;
          lVar4 = lVar4 + 1;
        } while( true );
      }
      lVar4 = 0;
LAB_001f9ad3:
      local_c0._0_8_ = local_ff._M_local_buf + 1;
      local_c0._8_8_ = &local_e0;
      unique0x00004e80 = &local_ec;
      local_98 = &local_78;
      local_90._M_allocated_capacity = (size_type)&local_ff;
      local_90._8_8_ = local_ff._M_local_buf + 3;
      local_80 = local_ff._M_local_buf + 2;
      auStack_ac._4_8_ = f;
      auStack_ac._12_8_ = &local_70;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,local_ff._7_8_ + lVar4,local_ff._7_8_ + lVar4,
                      (anon_class_72_9_0c6a3a8a *)local_c0);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      ppiVar6 = &local_60;
    }
    if ((int **)ppiVar6[-2] != ppiVar6) {
      operator_delete(ppiVar6[-2]);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}